

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O3

int __thiscall
rudp::rudp_server::connect(rudp_server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  function<void_(bool,_unsigned_int)> *this_00;
  io_service *ios;
  undefined8 uVar1;
  bool bVar2;
  __shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *this_01;
  session *this_02;
  undefined7 extraout_var;
  socklen_t __len_00;
  undefined4 in_register_0000000c;
  function<void_()> *pfVar3;
  key_type *pkVar4;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  key_type *__k;
  element_type *this_03;
  _Any_data local_98;
  code *local_88;
  anon_class_72_3_4357acd4 local_78;
  
  __k = (key_type *)CONCAT44(in_register_00000034,__fd);
  pfVar3 = (function<void_()> *)CONCAT44(in_register_0000000c,__len);
  this_01 = &std::
             map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
             ::operator[](&this->sessions,__k)->
             super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>;
  __len_00 = (socklen_t)pfVar3;
  this_03 = this_01->_M_ptr;
  if (this_03 == (element_type *)0x0) {
    this_02 = (session *)operator_new(0x5930);
    ios = this->io_service;
    local_78.this = this;
    std::function<void_()>::function
              ((function<void_()> *)&local_78.cb,
               (function<void_()> *)CONCAT44(in_register_0000000c,__len));
    std::function<void(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)>::
    function<rudp::rudp_server::connect(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(bool,unsigned_int)>const&,std::function<void()>const&)::_lambda(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)_1_,void>
              ((function<void(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)> *)
               local_98._M_pod_data,(anon_class_40_2_a03751d3 *)&local_78);
    pkVar4 = __k;
    session::session(this_02,ios,&this->socket,__k,
                     (function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)>
                      *)&local_98);
    __len_00 = (socklen_t)pkVar4;
    std::__shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>::reset<rudp::session>
              (this_01,this_02);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if (local_78.cb.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.cb.super__Function_base._M_manager)
                ((_Any_data *)&local_78.cb,(_Any_data *)&local_78.cb,__destroy_functor);
    }
    this_03 = this_01->_M_ptr;
  }
  this_00 = &local_78.cb;
  local_78.this = this;
  std::function<void_(bool,_unsigned_int)>::function
            (this_00,(function<void_(bool,_unsigned_int)> *)__addr);
  local_78.endpoint.impl_.data_._0_8_ = *(undefined8 *)&(__k->impl_).data_;
  uVar1 = *(undefined8 *)((long)&(__k->impl_).data_ + 8);
  local_78.endpoint.impl_.data_._20_8_ = *(undefined8 *)((long)&(__k->impl_).data_ + 0x14);
  local_78.endpoint.impl_.data_._16_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&(__k->impl_).data_ + 0xc) >> 0x20);
  local_78.endpoint.impl_.data_._8_4_ = (undefined4)uVar1;
  local_78.endpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  std::function<void(bool,unsigned_int)>::
  function<rudp::rudp_server::connect(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(bool,unsigned_int)>const&,std::function<void()>const&)::_lambda(bool,unsigned_int)_1_,void>
            ((function<void(bool,unsigned_int)> *)local_98._M_pod_data,&local_78);
  session::connect(this_03,(int)&local_98,__addr_00,__len_00);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_78.cb.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar2 = (*local_78.cb.super__Function_base._M_manager)
                      ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    local_78.cb.super__Function_base._M_manager = (_Manager_type)CONCAT71(extraout_var,bVar2);
  }
  return (int)local_78.cb.super__Function_base._M_manager;
}

Assistant:

void connect(
    const boost::asio::ip::udp::endpoint &endpoint,
    const std::function< void( bool, uint32_t ) > &cb,
    const std::function< void() > &on_close
  ) {
	   auto &sess = sessions[ endpoint ];
	   if( !sess ) sess.reset( new session( io_service, socket, endpoint, [this,on_close]( const boost::asio::ip::udp::endpoint &endpoint ) {
      auto s = sessions.find( endpoint );
      if( s != sessions.end() ) {
        session_bindings.erase( s->second->get_self_config().connection_identifier );
        sessions.erase( s );
        on_close();
      }
    } ) );
    sess->connect( [this,cb,endpoint]( bool status, uint32_t identifier ) {
      session_bindings.insert( std::make_pair( identifier, endpoint ) );
      cb( status, identifier );
    } );
  }